

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_decoder.c
# Opt level: O1

lzma_ret lzma2_decode(lzma_coder_conflict6 *coder,lzma_dict *dict,uint8_t *in,size_t *in_pos,
                     size_t in_size)

{
  lzma_options_lzma *options;
  byte bVar1;
  lzma_coder_conflict6 *plVar2;
  ulong uVar3;
  bool bVar4;
  _Bool _Var5;
  lzma_ret lVar6;
  size_t sVar7;
  lzma_ret lVar8;
  size_t in_start;
  lzma_vli lVar9;
  ulong uVar10;
  lzma_ret local_54;
  
  options = &coder->options;
  do {
    uVar10 = *in_pos;
    if ((in_size <= uVar10) && (coder->sequence != SEQ_LZMA)) {
      return LZMA_OK;
    }
    switch(coder->sequence) {
    case SEQ_CONTROL:
      bVar1 = in[uVar10];
      *in_pos = uVar10 + 1;
      bVar4 = true;
      if (bVar1 == 0) {
        local_54 = LZMA_STREAM_END;
        bVar4 = true;
      }
      else if (bVar1 < 0xe0 && bVar1 != 1) {
        if (coder->need_dictionary_reset == false) goto LAB_001b3651;
LAB_001b36d4:
        local_54 = LZMA_DATA_ERROR;
      }
      else {
        coder->need_properties = true;
        coder->need_dictionary_reset = true;
LAB_001b3651:
        if ((char)bVar1 < '\0') {
          coder->uncompressed_size = (ulong)((bVar1 & 0x1f) << 0x10);
          coder->sequence = SEQ_UNCOMPRESSED_1;
          if (bVar1 < 0xc0) {
            if (coder->need_properties != false) goto LAB_001b36d4;
            coder->next_sequence = SEQ_LZMA;
            if (0x9f < bVar1) {
              (*(coder->lzma).reset)((coder->lzma).coder,options);
            }
          }
          else {
            coder->need_properties = false;
            coder->next_sequence = SEQ_PROPERTIES;
          }
        }
        else {
          if (2 < bVar1) goto LAB_001b36d4;
          coder->sequence = SEQ_COMPRESSED_0;
          coder->next_sequence = SEQ_COPY;
        }
        bVar4 = false;
        if (coder->need_dictionary_reset == true) {
          coder->need_dictionary_reset = false;
          dict->need_reset = true;
          bVar4 = true;
          local_54 = LZMA_OK;
        }
      }
      if (bVar4) {
        return local_54;
      }
      break;
    case SEQ_UNCOMPRESSED_1:
      *in_pos = uVar10 + 1;
      coder->uncompressed_size = coder->uncompressed_size + (ulong)in[uVar10] * 0x100;
      coder->sequence = SEQ_UNCOMPRESSED_2;
      break;
    case SEQ_UNCOMPRESSED_2:
      *in_pos = uVar10 + 1;
      plVar2 = (coder->lzma).coder;
      lVar9 = (ulong)in[uVar10] + coder->uncompressed_size + 1;
      coder->uncompressed_size = lVar9;
      coder->sequence = SEQ_COMPRESSED_0;
      (*(coder->lzma).set_uncompressed)(plVar2,lVar9);
      break;
    case SEQ_COMPRESSED_0:
      *in_pos = uVar10 + 1;
      coder->compressed_size = (ulong)in[uVar10] << 8;
      coder->sequence = SEQ_COMPRESSED_1;
      break;
    case SEQ_COMPRESSED_1:
      *in_pos = uVar10 + 1;
      coder->compressed_size = (ulong)in[uVar10] + coder->compressed_size + 1;
      coder->sequence = coder->next_sequence;
      break;
    case SEQ_PROPERTIES:
      *in_pos = uVar10 + 1;
      _Var5 = lzma_lzma_lclppb_decode(options,in[uVar10]);
      if (_Var5) {
        return LZMA_DATA_ERROR;
      }
      (*(coder->lzma).reset)((coder->lzma).coder,options);
      coder->sequence = SEQ_LZMA;
      break;
    case SEQ_LZMA:
      lVar6 = (*(coder->lzma).code)((coder->lzma).coder,dict,in,in_pos,in_size);
      uVar10 = *in_pos - uVar10;
      uVar3 = coder->compressed_size;
      bVar4 = true;
      lVar8 = LZMA_DATA_ERROR;
      if (((uVar10 <= uVar3) &&
          (coder->compressed_size = uVar3 - uVar10, lVar8 = lVar6, lVar6 == LZMA_STREAM_END)) &&
         (lVar8 = LZMA_DATA_ERROR, uVar3 == uVar10)) {
        coder->sequence = SEQ_CONTROL;
        bVar4 = false;
        lVar8 = local_54;
      }
      local_54 = lVar8;
      if (bVar4) {
        return lVar8;
      }
      break;
    case SEQ_COPY:
      uVar3 = coder->compressed_size;
      sVar7 = uVar10 + uVar3;
      if (in_size - uVar10 <= uVar3) {
        sVar7 = in_size;
      }
      sVar7 = lzma_bufcpy(in,in_pos,sVar7,dict->buf,&dict->pos,dict->limit);
      coder->compressed_size = uVar3 - sVar7;
      if (dict->full < dict->pos) {
        dict->full = dict->pos;
      }
      if (uVar3 != sVar7) {
        return LZMA_OK;
      }
      coder->sequence = SEQ_CONTROL;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_decoder.c"
                    ,0xcb,
                    "lzma_ret lzma2_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                   );
    }
  } while( true );
}

Assistant:

static lzma_ret
lzma2_decode(lzma_coder *LZMA_RESTRICT coder, lzma_dict *LZMA_RESTRICT dict,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size)
{
	// With SEQ_LZMA it is possible that no new input is needed to do
	// some progress. The rest of the sequences assume that there is
	// at least one byte of input.
	while (*in_pos < in_size || coder->sequence == SEQ_LZMA)
	switch (coder->sequence) {
	case SEQ_CONTROL: {
		const uint32_t control = in[*in_pos];
		++*in_pos;

		// End marker
		if (control == 0x00)
			return LZMA_STREAM_END;

		if (control >= 0xE0 || control == 1) {
			// Dictionary reset implies that next LZMA chunk has
			// to set new properties.
			coder->need_properties = true;
			coder->need_dictionary_reset = true;
		} else if (coder->need_dictionary_reset) {
			return LZMA_DATA_ERROR;
		}

		if (control >= 0x80) {
			// LZMA chunk. The highest five bits of the
			// uncompressed size are taken from the control byte.
			coder->uncompressed_size = (control & 0x1F) << 16;
			coder->sequence = SEQ_UNCOMPRESSED_1;

			// See if there are new properties or if we need to
			// reset the state.
			if (control >= 0xC0) {
				// When there are new properties, state reset
				// is done at SEQ_PROPERTIES.
				coder->need_properties = false;
				coder->next_sequence = SEQ_PROPERTIES;

			} else if (coder->need_properties) {
				return LZMA_DATA_ERROR;

			} else {
				coder->next_sequence = SEQ_LZMA;

				// If only state reset is wanted with old
				// properties, do the resetting here for
				// simplicity.
				if (control >= 0xA0)
					coder->lzma.reset(coder->lzma.coder,
							&coder->options);
			}
		} else {
			// Invalid control values
			if (control > 2)
				return LZMA_DATA_ERROR;

			// It's uncompressed chunk
			coder->sequence = SEQ_COMPRESSED_0;
			coder->next_sequence = SEQ_COPY;
		}

		if (coder->need_dictionary_reset) {
			// Finish the dictionary reset and let the caller
			// flush the dictionary to the actual output buffer.
			coder->need_dictionary_reset = false;
			dict_reset(dict);
			return LZMA_OK;
		}

		break;
	}

	case SEQ_UNCOMPRESSED_1:
		coder->uncompressed_size += (uint32_t)(in[(*in_pos)++]) << 8;
		coder->sequence = SEQ_UNCOMPRESSED_2;
		break;

	case SEQ_UNCOMPRESSED_2:
		coder->uncompressed_size += in[(*in_pos)++] + 1;
		coder->sequence = SEQ_COMPRESSED_0;
		coder->lzma.set_uncompressed(coder->lzma.coder,
				coder->uncompressed_size);
		break;

	case SEQ_COMPRESSED_0:
		coder->compressed_size = (uint32_t)(in[(*in_pos)++]) << 8;
		coder->sequence = SEQ_COMPRESSED_1;
		break;

	case SEQ_COMPRESSED_1:
		coder->compressed_size += in[(*in_pos)++] + 1;
		coder->sequence = coder->next_sequence;
		break;

	case SEQ_PROPERTIES:
		if (lzma_lzma_lclppb_decode(&coder->options, in[(*in_pos)++]))
			return LZMA_DATA_ERROR;

		coder->lzma.reset(coder->lzma.coder, &coder->options);

		coder->sequence = SEQ_LZMA;
		break;

	case SEQ_LZMA: {
		// Store the start offset so that we can update
		// coder->compressed_size later.
		const size_t in_start = *in_pos;

		// Decode from in[] to *dict.
		const lzma_ret ret = coder->lzma.code(coder->lzma.coder,
				dict, in, in_pos, in_size);

		// Validate and update coder->compressed_size.
		const size_t in_used = *in_pos - in_start;
		if (in_used > coder->compressed_size)
			return LZMA_DATA_ERROR;

		coder->compressed_size -= in_used;

		// Return if we didn't finish the chunk, or an error occurred.
		if (ret != LZMA_STREAM_END)
			return ret;

		// The LZMA decoder must have consumed the whole chunk now.
		// We don't need to worry about uncompressed size since it
		// is checked by the LZMA decoder.
		if (coder->compressed_size != 0)
			return LZMA_DATA_ERROR;

		coder->sequence = SEQ_CONTROL;
		break;
	}

	case SEQ_COPY: {
		// Copy from input to the dictionary as is.
		dict_write(dict, in, in_pos, in_size, &coder->compressed_size);
		if (coder->compressed_size != 0)
			return LZMA_OK;

		coder->sequence = SEQ_CONTROL;
		break;
	}

	default:
		assert(0);
		return LZMA_PROG_ERROR;
	}

	return LZMA_OK;
}